

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O0

void __thiscall n_e_s::core::Pipeline::clear(Pipeline *this)

{
  bool bVar1;
  Pipeline *this_local;
  
  while( true ) {
    bVar1 = std::
            deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
            ::empty(&this->steps_);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::
    deque<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
    ::pop_front(&this->steps_);
  }
  this->continue_ = true;
  return;
}

Assistant:

void Pipeline::clear() {
    while (!steps_.empty()) {
        steps_.pop_front();
    }
    continue_ = true;
}